

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O0

void __thiscall
CTcSymObjBase::CTcSymObjBase
          (CTcSymObjBase *this,char *str,size_t len,int copy,ulong obj_id,int is_extern,
          tc_metaclass_t meta,CTcDictEntry *dict)

{
  undefined4 in_ECX;
  undefined8 *in_RDI;
  char *in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  CTcSymbol::CTcSymbol
            ((CTcSymbol *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,
             CONCAT44(in_R9D,in_stack_ffffffffffffffd0),(int)((ulong)in_RDI >> 0x20),
             (tc_symtype_t)in_RDI);
  *in_RDI = &PTR__CTcSymObjBase_003d23a8;
  in_RDI[5] = in_R8;
  *(ushort *)(in_RDI + 0x17) = *(ushort *)(in_RDI + 0x17) & 0xfffe | (ushort)in_R9D & 1;
  *(ushort *)(in_RDI + 0x17) = *(ushort *)(in_RDI + 0x17) & 0xfffd;
  in_RDI[6] = 0xffffffff;
  *(ushort *)(in_RDI + 0x17) = *(ushort *)(in_RDI + 0x17) & 0xfff7;
  *(ushort *)(in_RDI + 0x17) = *(ushort *)(in_RDI + 0x17) & 0xfffb;
  *(ushort *)(in_RDI + 0x17) = *(ushort *)(in_RDI + 0x17) & 0xffef;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  *(undefined4 *)(in_RDI + 0x12) = in_stack_00000008;
  in_RDI[0xc] = obj_id;
  *(ushort *)(in_RDI + 0x17) = *(ushort *)(in_RDI + 0x17) & 0xffbf;
  *(ushort *)(in_RDI + 0x17) = *(ushort *)(in_RDI + 0x17) & 0xff7f;
  *(undefined4 *)(in_RDI + 0x15) = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  *(ushort *)(in_RDI + 0x17) = *(ushort *)(in_RDI + 0x17) & 0xffdf;
  *(ushort *)(in_RDI + 0x17) = *(ushort *)(in_RDI + 0x17) & 0xfeff;
  *(ushort *)(in_RDI + 0x17) = *(ushort *)(in_RDI + 0x17) & 0xfdff;
  in_RDI[0x11] = 0;
  *(ushort *)(in_RDI + 0x17) = *(ushort *)(in_RDI + 0x17) & 0xfbff;
  in_RDI[0x14] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x16] = 0;
  *(ushort *)(in_RDI + 0x17) = *(ushort *)(in_RDI + 0x17) & 0xf7ff;
  return;
}

Assistant:

CTcSymObjBase(const char *str, size_t len, int copy, ulong obj_id,
                  int is_extern, tc_metaclass_t meta,
                  class CTcDictEntry *dict)
        : CTcSymbol(str, len, copy, TC_SYM_OBJ)
    {
        /* store the object ID */
        obj_id_ = obj_id;

        /* note whether it's external */
        is_extern_ = is_extern;

        /* we're not yet referenced */
        ref_ = FALSE;

        /* we don't have a stream offset yet */
        stream_ofs_ = 0xffffffff;

        /* we're don't 'modify' or 'replace' an external object */
        ext_modify_ = ext_replace_ = FALSE;

        /* I haven't been modified yet */
        modified_ = FALSE;

        /* presume we won't modify another object */
        mod_base_sym_ = 0;

        /* presume we won't be modified by another object */
        modifying_obj_.sym_ = 0;

        /* no parse tree yet */
        obj_stm_ = 0;

        /* no self-reference fixups yet */
        fixups_ = 0;

        /* no deleted properties yet */
        first_del_prop_ = 0;

        /* set the metaclass */
        metaclass_ = meta;

        /* set the dictionary */
        dict_ = dict;

        /* not yet written to object file */
        written_to_obj_ = FALSE;
        counted_in_obj_ = FALSE;

        /* no object file index yet */
        obj_file_idx_ = 0;

        /* no vocabulary yet */
        vocab_ = 0;

        /* no superclasses in our list yet */
        sc_ = 0;

        /* no superclass names in our list yet */
        sc_name_head_ = 0;
        sc_name_tail_ = 0;

        /* presume we're not a class */
        is_class_ = FALSE;

        /* we haven't built our inherited vocabulary list yet */
        vocab_inherited_ = FALSE;

        /* presume we're fully nonymous */
        anon_ = FALSE;

        /* assume we will have no metaclass-specific extra data object */
        meta_extra_ = 0;

        /* we're not yet explicitly based on the root object class */
        sc_is_root_ = FALSE;

        /* no templates for this class yet */
        template_head_ = template_tail_ = 0;

        /* we don't have a private grammar rule list yet */
        grammar_entry_ = 0;

        /* presume it's not transient */
        transient_ = FALSE;
    }